

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_reader.hpp
# Opt level: O0

bool IsInteger(char *str)

{
  int iVar1;
  char *in_RDI;
  char *ptr;
  char *local_18;
  
  local_18 = in_RDI;
  while( true ) {
    if (*local_18 == '\0') {
      return true;
    }
    iVar1 = isdigit((int)*local_18);
    if ((iVar1 == 0) && ((local_18 != in_RDI || (*local_18 != '-')))) break;
    local_18 = local_18 + 1;
  }
  return false;
}

Assistant:

inline bool IsInteger(const char *str) {
    const char *ptr = str;
    while (*ptr != '\0') {
        if (std::isdigit(*ptr) ||
            (ptr == str && *ptr == '-')) 
        {
            ptr++;
            continue;
        }
        return false;
    }
    return true;
}